

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlFloat::ReadData(EbmlFloat *this,IOCallback *input,ScopeMode ReadFully)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 *puVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  big_int32 TmpRead;
  binary Buffer [20];
  undefined8 local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  
  if (ReadFully != SCOPE_NO_DATA) {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (0x14 < CONCAT44(extraout_var,iVar2)) {
      __assert_fail("GetSize() <= 20",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                    ,0x7c,"virtual filepos_t libebml::EbmlFloat::ReadData(IOCallback &, ScopeMode)")
      ;
    }
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::readFully(input,&local_28,CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_01,iVar2) == 4) {
      puVar3 = (undefined1 *)((long)&local_38 + 3);
      local_38 = (double)CONCAT44(local_28,local_28);
      lVar4 = 0;
      do {
        uVar1 = *(undefined1 *)((long)&local_38 + lVar4);
        *(undefined1 *)((long)&local_38 + lVar4) = *puVar3;
        *puVar3 = uVar1;
        lVar4 = lVar4 + 1;
        puVar3 = puVar3 + -1;
      } while (lVar4 != 2);
      local_38 = (double)(float)local_38;
    }
    else {
      iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var_02,iVar2) != 8) goto LAB_001847f4;
      local_38 = (double)CONCAT44(uStack_24,local_28);
      puVar3 = (undefined1 *)((long)&local_38 + 7);
      lVar4 = 0;
      do {
        uVar1 = *(undefined1 *)((long)&local_38 + lVar4);
        *(undefined1 *)((long)&local_38 + lVar4) = *puVar3;
        *puVar3 = uVar1;
        lVar4 = lVar4 + 1;
        puVar3 = puVar3 + -1;
      } while (lVar4 != 4);
    }
    this->Value = local_38;
    (this->super_EbmlElement).bValueIsSet = true;
  }
LAB_001847f4:
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_03,iVar2);
}

Assistant:

filepos_t EbmlFloat::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[20];
    assert(GetSize() <= 20);
    input.readFully(Buffer, GetSize());

    if (GetSize() == 4) {
      big_int32 TmpRead;
      TmpRead.Eval(Buffer);
      int32 tmpp = int32(TmpRead);
      float val;
      memcpy(&val, &tmpp, 4);
      Value = val;
      SetValueIsSet();
    } else if (GetSize() == 8) {
      big_int64 TmpRead;
      TmpRead.Eval(Buffer);
      int64 tmpp = int64(TmpRead);
      double val;
      memcpy(&val, &tmpp, 8);
      Value = val;
      SetValueIsSet();
    }
  }

  return GetSize();
}